

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int set_sort_compare(lyxp_set_nodes *item1,lyxp_set_nodes *item2,lyd_node *root)

{
  lyxp_node_type lVar1;
  lyxp_node_type lVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  lyd_node *plVar5;
  LY_ERR *pLVar6;
  undefined8 uVar7;
  int iVar8;
  lyd_attr *attr;
  
  if (item1->pos < item2->pos) {
    return -1;
  }
  if (item2->pos < item1->pos) {
LAB_00170c90:
    iVar8 = 1;
  }
  else {
    attr = (lyd_attr *)item2->node;
    lVar1 = item1->type;
    if (((lyd_attr *)item1->node == attr) && (lVar2 = item2->type, lVar1 != lVar2)) {
      if (lVar1 == LYXP_NODE_TEXT) {
        if (lVar2 == LYXP_NODE_ELEM) {
          return 1;
        }
      }
      else if (lVar1 == LYXP_NODE_ELEM) {
        if (lVar2 == LYXP_NODE_TEXT) {
          return -1;
        }
        __assert_fail("item2->type == LYXP_NODE_TEXT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4af,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
      __assert_fail("(item1->type == LYXP_NODE_TEXT) && (item2->type == LYXP_NODE_ELEM)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x4b2,
                    "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                   );
    }
    uVar3 = 0;
    if (lVar1 == LYXP_NODE_ATTR) {
      plVar5 = lyd_attr_parent(root,(lyd_attr *)item1->node);
      if (plVar5 == (lyd_node *)0x0) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EINT;
        uVar7 = 0x4bb;
        goto LAB_00170e16;
      }
      uVar3 = get_attr_pos((lyd_attr *)item1->node,plVar5);
      attr = (lyd_attr *)item2->node;
    }
    uVar4 = 0;
    if (item2->type == LYXP_NODE_ATTR) {
      plVar5 = lyd_attr_parent(root,attr);
      if (plVar5 == (lyd_node *)0x0) {
        pLVar6 = ly_errno_location();
        *pLVar6 = LY_EINT;
        uVar7 = 0x4c3;
LAB_00170e16:
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,uVar7);
        return -1;
      }
      uVar4 = get_attr_pos((lyd_attr *)item2->node,plVar5);
      attr = (lyd_attr *)item2->node;
    }
    lVar1 = item1->type;
    if ((lyd_attr *)item1->node == attr) {
      if (lVar1 == item2->type) {
        if (lVar1 != LYXP_NODE_ATTR) {
          return 0;
        }
        if (uVar3 == uVar4) {
          return 0;
        }
      }
      __assert_fail("(item1->type == item2->type) && ((item1->type != LYXP_NODE_ATTR) || (attr_pos1 == attr_pos2))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x4cc,
                    "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                   );
    }
    if (lVar1 == LYXP_NODE_ATTR) {
      if (item2->type == LYXP_NODE_ELEM) goto LAB_00170c90;
      if ((item2->type == LYXP_NODE_ATTR) && (uVar4 < uVar3)) {
        return 1;
      }
    }
    else {
      if (lVar1 == LYXP_NODE_TEXT) {
        return -(uint)((item2->type - LYXP_NODE_ELEM & 0xfffffffd) != 0) | 1;
      }
      if (lVar1 == LYXP_NODE_ELEM) {
        if (item2->type != LYXP_NODE_ELEM) {
          return -1;
        }
        __assert_fail("item2->type != LYXP_NODE_ELEM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4d3,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
    }
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

static int
set_sort_compare(struct lyxp_set_nodes *item1, struct lyxp_set_nodes *item2,
                 const struct lyd_node *root)
{
    const struct lyd_node *tmp_node;
    uint32_t attr_pos1 = 0, attr_pos2 = 0;

    if (item1->pos < item2->pos) {
        return -1;
    }

    if (item1->pos > item2->pos) {
        return 1;
    }

    /* node positions are equal, the fun case */

    /* 1st ELEM - == - 2nd TEXT, 1st TEXT - == - 2nd ELEM */
    /* special case since text nodes are actually saved as their parents */
    if ((item1->node == item2->node) && (item1->type != item2->type)) {
        if (item1->type == LYXP_NODE_ELEM) {
            assert(item2->type == LYXP_NODE_TEXT);
            return -1;
        } else {
            assert((item1->type == LYXP_NODE_TEXT) && (item2->type == LYXP_NODE_ELEM));
            return 1;
        }
    }

    /* we need attr positions now */
    if (item1->type == LYXP_NODE_ATTR) {
        tmp_node = lyd_attr_parent(root, (struct lyd_attr *)item1->node);
        if (!tmp_node) {
            LOGINT;
            return -1;
        }
        attr_pos1 = get_attr_pos((struct lyd_attr *)item1->node, tmp_node);
    }
    if (item2->type == LYXP_NODE_ATTR) {
        tmp_node = lyd_attr_parent(root, (struct lyd_attr *)item2->node);
        if (!tmp_node) {
            LOGINT;
            return -1;
        }
        attr_pos2 = get_attr_pos((struct lyd_attr *)item2->node, tmp_node);
    }

    /* 1st ROOT - 2nd ROOT, 1st ELEM - 2nd ELEM, 1st TEXT - 2nd TEXT, 1st ATTR - =pos= - 2nd ATTR */
    /* check for duplicates */
    if (item1->node == item2->node) {
        assert((item1->type == item2->type) && ((item1->type != LYXP_NODE_ATTR) || (attr_pos1 == attr_pos2)));
        return 0;
    }

    /* 1st ELEM - 2nd TEXT, 1st ELEM - any pos - 2nd ATTR */
    /* elem is always first, 2nd node is after it */
    if (item1->type == LYXP_NODE_ELEM) {
        assert(item2->type != LYXP_NODE_ELEM);
        return -1;
    }

    /* 1st TEXT - 2nd ELEM, 1st TEXT - any pos - 2nd ATTR, 1st ATTR - any pos - 2nd ELEM, 1st ATTR - >pos> - 2nd ATTR */
    /* 2nd is before 1st */
    if (((item1->type == LYXP_NODE_TEXT)
            && ((item2->type == LYXP_NODE_ELEM) || (item2->type == LYXP_NODE_ATTR)))
            || ((item1->type == LYXP_NODE_ATTR) && (item2->type == LYXP_NODE_ELEM))
            || (((item1->type == LYXP_NODE_ATTR) && (item2->type == LYXP_NODE_ATTR))
            && (attr_pos1 > attr_pos2))) {
        return 1;
    }

    /* 1st ATTR - any pos - 2nd TEXT, 1st ATTR <pos< - 2nd ATTR */
    /* 2nd is after 1st */
    return -1;
}